

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockPlanar57c
               (uint compressed57_1,uint compressed57_2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint8 local_48;
  uint8 local_44;
  uint8 local_40;
  uint8 local_3c;
  uint8 local_38;
  uint8 local_34;
  int yy;
  int xx;
  uint8 colorV [3];
  uint8 colorH [3];
  uint8 colorO [3];
  int startx_local;
  int height_local;
  int width_local;
  uint8 *img_local;
  uint compressed57_2_local;
  uint compressed57_1_local;
  
  bVar8 = (byte)(compressed57_1 >> 0x1a);
  bVar1 = (byte)(compressed57_1 >> 0x13) & 0x7f;
  bVar2 = (byte)(compressed57_1 >> 0xd) & 0x3f;
  bVar3 = (byte)(compressed57_1 >> 7) & 0x3f;
  bVar4 = (byte)compressed57_1 & 0x7f;
  bVar9 = (byte)(compressed57_2 >> 0x1a);
  bVar5 = (byte)(compressed57_2 >> 0x14) & 0x3f;
  bVar6 = (byte)(compressed57_2 >> 0xd) & 0x7f;
  bVar7 = (byte)(compressed57_2 >> 7) & 0x3f;
  bVar8 = bVar8 << 2 | (byte)((int)(uint)bVar8 >> 4);
  bVar1 = bVar1 << 1 | (byte)((int)(uint)bVar1 >> 6);
  bVar2 = bVar2 << 2 | (byte)((int)(uint)bVar2 >> 4);
  bVar3 = bVar3 << 2 | (byte)((int)(uint)bVar3 >> 4);
  bVar4 = bVar4 << 1 | (byte)((int)(uint)bVar4 >> 6);
  bVar9 = bVar9 << 2 | (byte)((int)(uint)bVar9 >> 4);
  bVar5 = bVar5 << 2 | (byte)((int)(uint)bVar5 >> 4);
  bVar6 = bVar6 << 1 | (byte)((int)(uint)bVar6 >> 6);
  bVar7 = bVar7 << 2 | (byte)((int)(uint)bVar7 >> 4);
  for (xx = 0; xx < 4; xx = xx + 1) {
    for (yy = 0; yy < 4; yy = yy + 1) {
      if ((int)(xx * ((uint)bVar3 - (uint)bVar8) + yy * ((uint)bVar5 - (uint)bVar8) +
                (uint)bVar8 * 4 + 2) >> 2 < 0) {
        local_34 = '\0';
      }
      else {
        if ((int)(xx * ((uint)bVar3 - (uint)bVar8) + yy * ((uint)bVar5 - (uint)bVar8) +
                  (uint)bVar8 * 4 + 2) >> 2 < 0x100) {
          local_38 = (uint8)((int)(xx * ((uint)bVar3 - (uint)bVar8) +
                                   yy * ((uint)bVar5 - (uint)bVar8) + (uint)bVar8 * 4 + 2) >> 2);
        }
        else {
          local_38 = 0xff;
        }
        local_34 = local_38;
      }
      img[channels * width * (starty + yy) + channels * (startx + xx)] = local_34;
      if ((int)(xx * ((uint)bVar4 - (uint)bVar1) + yy * ((uint)bVar6 - (uint)bVar1) +
                (uint)bVar1 * 4 + 2) >> 2 < 0) {
        local_3c = '\0';
      }
      else {
        if ((int)(xx * ((uint)bVar4 - (uint)bVar1) + yy * ((uint)bVar6 - (uint)bVar1) +
                  (uint)bVar1 * 4 + 2) >> 2 < 0x100) {
          local_40 = (uint8)((int)(xx * ((uint)bVar4 - (uint)bVar1) +
                                   yy * ((uint)bVar6 - (uint)bVar1) + (uint)bVar1 * 4 + 2) >> 2);
        }
        else {
          local_40 = 0xff;
        }
        local_3c = local_40;
      }
      img[channels * width * (starty + yy) + channels * (startx + xx) + 1] = local_3c;
      if ((int)(xx * ((uint)bVar9 - (uint)bVar2) + yy * ((uint)bVar7 - (uint)bVar2) +
                (uint)bVar2 * 4 + 2) >> 2 < 0) {
        local_44 = '\0';
      }
      else {
        if ((int)(xx * ((uint)bVar9 - (uint)bVar2) + yy * ((uint)bVar7 - (uint)bVar2) +
                  (uint)bVar2 * 4 + 2) >> 2 < 0x100) {
          local_48 = (uint8)((int)(xx * ((uint)bVar9 - (uint)bVar2) +
                                   yy * ((uint)bVar7 - (uint)bVar2) + (uint)bVar2 * 4 + 2) >> 2);
        }
        else {
          local_48 = 0xff;
        }
        local_44 = local_48;
      }
      img[channels * width * (starty + yy) + channels * (startx + xx) + 2] = local_44;
    }
  }
  return;
}

Assistant:

void decompressBlockPlanar57c(unsigned int compressed57_1, unsigned int compressed57_2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 colorO[3], colorH[3], colorV[3];

	colorO[0] = GETBITSHIGH( compressed57_1, 6, 63);
	colorO[1] = GETBITSHIGH( compressed57_1, 7, 57);
	colorO[2] = GETBITSHIGH( compressed57_1, 6, 50);
	colorH[0] = GETBITSHIGH( compressed57_1, 6, 44);
	colorH[1] = GETBITSHIGH( compressed57_1, 7, 38);
	colorH[2] = GETBITS(     compressed57_2, 6, 31);
	colorV[0] = GETBITS(     compressed57_2, 6, 25);
	colorV[1] = GETBITS(     compressed57_2, 7, 19);
	colorV[2] = GETBITS(     compressed57_2, 6, 12);

	colorO[0] = (colorO[0] << 2) | (colorO[0] >> 4);
	colorO[1] = (colorO[1] << 1) | (colorO[1] >> 6);
	colorO[2] = (colorO[2] << 2) | (colorO[2] >> 4);

	colorH[0] = (colorH[0] << 2) | (colorH[0] >> 4);
	colorH[1] = (colorH[1] << 1) | (colorH[1] >> 6);
	colorH[2] = (colorH[2] << 2) | (colorH[2] >> 4);

	colorV[0] = (colorV[0] << 2) | (colorV[0] >> 4);
	colorV[1] = (colorV[1] << 1) | (colorV[1] >> 6);
	colorV[2] = (colorV[2] << 2) | (colorV[2] >> 4);

	int xx, yy;

	for( xx=0; xx<4; xx++)
	{
		for( yy=0; yy<4; yy++)
		{
			img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = CLAMP(0, ((xx*(colorH[0]-colorO[0]) + yy*(colorV[0]-colorO[0]) + 4*colorO[0] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = CLAMP(0, ((xx*(colorH[1]-colorO[1]) + yy*(colorV[1]-colorO[1]) + 4*colorO[1] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = CLAMP(0, ((xx*(colorH[2]-colorO[2]) + yy*(colorV[2]-colorO[2]) + 4*colorO[2] + 2) >> 2),255);

			//Equivalent method
			/*img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[0]-colorO[0])/4.0 + yy*(colorV[0]-colorO[0])/4.0 + colorO[0])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[1]-colorO[1])/4.0 + yy*(colorV[1]-colorO[1])/4.0 + colorO[1])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[2]-colorO[2])/4.0 + yy*(colorV[2]-colorO[2])/4.0 + colorO[2])), 255);*/
			
		}
	}
}